

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yy.c
# Opt level: O1

void yy_lex_common(yy_lex_intern *x,envy_loc *loc,char *str)

{
  loc->lstart = x->line;
  loc->cstart = x->pos;
  do {
    if (*str == '\n') {
      x->pos = 1;
      x->line = x->line + 1;
    }
    else {
      if (*str == '\0') {
        loc->lend = x->line;
        loc->cend = x->pos;
        loc->file = x->file;
        return;
      }
      x->pos = x->pos + 1;
    }
    str = str + 1;
  } while( true );
}

Assistant:

void yy_lex_common(struct yy_lex_intern *x, YYLTYPE *loc, const char *str) {
	int i;
	loc->lstart = x->line;
	loc->cstart = x->pos;
	for (i = 0; str[i]; i++) {
		if (str[i] == '\n') {
			x->pos = 1;
			x->line++;
		} else {
			x->pos++;
		}
	}
	loc->lend = x->line;
	loc->cend = x->pos;
	loc->file = x->file;
}